

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::CreateDeath(CGameContext *this,vec2 Pos,int ClientID)

{
  int *piVar1;
  int in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  CNetEvent_Death *pEvent;
  float local_8;
  float fStack_4;
  
  piVar1 = (int *)CEventHandler::Create((CEventHandler *)(in_RDI + 0x510),0x14,0xc,-1);
  if (piVar1 != (int *)0x0) {
    local_8 = (float)in_XMM0_Qa;
    *piVar1 = (int)local_8;
    fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
    piVar1[1] = (int)fStack_4;
    piVar1[2] = in_ESI;
  }
  return;
}

Assistant:

void CGameContext::CreateDeath(vec2 Pos, int ClientID)
{
	// create the event
	CNetEvent_Death *pEvent = (CNetEvent_Death *)m_Events.Create(NETEVENTTYPE_DEATH, sizeof(CNetEvent_Death));
	if(pEvent)
	{
		pEvent->m_X = (int)Pos.x;
		pEvent->m_Y = (int)Pos.y;
		pEvent->m_ClientID = ClientID;
	}
}